

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O3

int32_t benchmark::Int32FromEnv(char *flag,int32_t default_value)

{
  bool bVar1;
  char *str;
  long *plVar2;
  ostream *poVar3;
  size_type *psVar4;
  char *in_RDX;
  int32_t iVar5;
  _Alloc_hider _Var6;
  int32_t result;
  string env_var;
  int32_t local_8c;
  string local_88;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  FlagToEnvVar_abi_cxx11_(&local_68,(benchmark *)flag,in_RDX);
  _Var6._M_p = local_68._M_dataplus._M_p;
  str = getenv(local_68._M_dataplus._M_p);
  iVar5 = default_value;
  if (str != (char *)0x0) {
    local_8c = default_value;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Environment variable ","");
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_48,(ulong)local_68._M_dataplus._M_p);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_88.field_2._M_allocated_capacity = *psVar4;
      local_88.field_2._8_8_ = plVar2[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar4;
      local_88._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_88._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    bVar1 = ParseInt32(&local_88,str,&local_8c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    _Var6._M_p = local_68._M_dataplus._M_p;
    iVar5 = local_8c;
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The default value ",0x12);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,default_value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," is used.\n",10);
      _Var6._M_p = local_68._M_dataplus._M_p;
      iVar5 = default_value;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != &local_68.field_2) {
    operator_delete(_Var6._M_p);
  }
  return iVar5;
}

Assistant:

int32_t Int32FromEnv(const char* flag, int32_t default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  int32_t result = default_value;
  if (!ParseInt32(std::string("Environment variable ") + env_var, string_value,
                  &result)) {
    std::cout << "The default value " << default_value << " is used.\n";
    return default_value;
  }

  return result;
}